

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar_p.h
# Opt level: O0

void __thiscall QTabBarPrivate::Tab::~Tab(Tab *this)

{
  unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
  *in_RDI;
  
  std::
  unique_ptr<QTabBarPrivate::Tab::TabBarAnimation,_std::default_delete<QTabBarPrivate::Tab::TabBarAnimation>_>
  ::~unique_ptr(in_RDI);
  ::QVariant::~QVariant((QVariant *)(in_RDI + 0x15));
  QIcon::~QIcon((QIcon *)(in_RDI + 0xc));
  QString::~QString((QString *)0x6b5f20);
  QString::~QString((QString *)0x6b5f2e);
  QString::~QString((QString *)0x6b5f3c);
  QString::~QString((QString *)0x6b5f46);
  return;
}

Assistant:

inline Tab(const QIcon &ico, const QString &txt)
        : text(txt), icon(ico), enabled(true), visible(true), measuringMinimum(false)
        {
        }